

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.h
# Opt level: O2

Matrix4x4 * __thiscall
CS248::DynamicScene::SceneObject::getObjectToWorld
          (Matrix4x4 *__return_storage_ptr__,SceneObject *this)

{
  Vector3D local_468;
  Vector3D local_448;
  Matrix4x4 T;
  Matrix4x4 local_3b0;
  Matrix4x4 local_330;
  Matrix4x4 local_2b0;
  Matrix4x4 scaleXform;
  Matrix4x4 RZ;
  Matrix4x4 RY;
  Matrix4x4 RX;
  
  local_448.x = (this->position_).x;
  local_448.y = (this->position_).y;
  local_448.z = (this->position_).z;
  Matrix4x4::translation(&local_448);
  Matrix4x4::rotation(&RX,(this->rotation_).x * 0.01745329238474369,X);
  Matrix4x4::rotation(&RY,(this->rotation_).y * 0.01745329238474369,Y);
  Matrix4x4::rotation(&RZ,(this->rotation_).z * 0.01745329238474369,Z);
  local_468.x = (this->scale_).x;
  local_468.y = (this->scale_).y;
  local_468.z = (this->scale_).z;
  Matrix4x4::scaling(&scaleXform,&local_468);
  Matrix4x4::operator*(&local_3b0,&T,&RX);
  Matrix4x4::operator*(&local_330,&local_3b0,&RY);
  Matrix4x4::operator*(&local_2b0,&local_330,&RZ);
  Matrix4x4::operator*(__return_storage_ptr__,&local_2b0,&scaleXform);
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 getObjectToWorld() const {
   
        float deg2Rad = M_PI / 180.0;
    
        Matrix4x4 T = Matrix4x4::translation(position_);
        Matrix4x4 RX = Matrix4x4::rotation(rotation_.x * deg2Rad, Matrix4x4::Axis::X);
        Matrix4x4 RY = Matrix4x4::rotation(rotation_.y * deg2Rad, Matrix4x4::Axis::Y);
        Matrix4x4 RZ = Matrix4x4::rotation(rotation_.z * deg2Rad, Matrix4x4::Axis::Z);
        Matrix4x4 scaleXform = Matrix4x4::scaling(scale_);
    
        // object to world transformation
        Matrix4x4 objectToWorld = T * RX * RY * RZ * scaleXform;
        return objectToWorld;
    }